

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_enum_util.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::LookUpEnumValue
          (internal *this,EnumEntry *enums,size_t size,StringPiece name,int *value)

{
  StringPiece y;
  bool bVar1;
  EnumEntry *pEVar2;
  EnumEntry *it;
  EnumEntry target;
  int *value_local;
  size_t size_local;
  EnumEntry *enums_local;
  StringPiece name_local;
  
  target._16_8_ = name.length_;
  target.name.length_._0_4_ = 0;
  it = (EnumEntry *)size;
  target.name.ptr_ = name.ptr_;
  pEVar2 = std::
           lower_bound<google::protobuf::internal::EnumEntry_const*,google::protobuf::internal::EnumEntry,bool(*)(google::protobuf::internal::EnumEntry_const&,google::protobuf::internal::EnumEntry_const&)>
                     ((EnumEntry *)this,(EnumEntry *)(this + (long)enums * 0x18),(EnumEntry *)&it,
                      anon_unknown_3::EnumCompareByName);
  if ((pEVar2 == (EnumEntry *)(this + (long)enums * 0x18)) ||
     (y.length_ = (size_type)name.ptr_, y.ptr_ = (char *)size,
     bVar1 = stringpiece_internal::operator==(pEVar2->name,y), !bVar1)) {
    name_local.length_._7_1_ = false;
  }
  else {
    *(int *)target._16_8_ = pEVar2->value;
    name_local.length_._7_1_ = true;
  }
  return name_local.length_._7_1_;
}

Assistant:

bool LookUpEnumValue(const EnumEntry* enums, size_t size,
                     StringPiece name, int* value) {
  EnumEntry target{name, 0};
  auto it = std::lower_bound(enums, enums + size, target, EnumCompareByName);
  if (it != enums + size && it->name == name) {
    *value = it->value;
    return true;
  }
  return false;
}